

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prep.h
# Opt level: O2

void __thiscall
Professor::Professor
          (Professor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data)

{
  int iVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->surname)._M_dataplus._M_p = (pointer)&(this->surname).field_2;
  (this->surname)._M_string_length = 0;
  (this->surname).field_2._M_local_buf[0] = '\0';
  (this->middle_name)._M_dataplus._M_p = (pointer)&(this->middle_name).field_2;
  (this->middle_name)._M_string_length = 0;
  (this->middle_name).field_2._M_local_buf[0] = '\0';
  (this->link)._M_dataplus._M_p = (pointer)&(this->link).field_2;
  (this->link)._M_string_length = 0;
  (this->link).field_2._M_local_buf[0] = '\0';
  iVar1 = std::__cxx11::stoi((data->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0,10);
  this->prep_id = iVar1;
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::_M_assign((string *)&this->surname);
  std::__cxx11::string::_M_assign((string *)&this->middle_name);
  iVar1 = std::__cxx11::stoi((data->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 4,(size_t *)0x0,10);
  this->knowledge = (double)iVar1;
  iVar1 = std::__cxx11::stoi((data->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 5,(size_t *)0x0,10);
  this->skill = (double)iVar1;
  iVar1 = std::__cxx11::stoi((data->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 6,(size_t *)0x0,10);
  this->social = (double)iVar1;
  iVar1 = std::__cxx11::stoi((data->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 7,(size_t *)0x0,10);
  this->loyality = (double)iVar1;
  iVar1 = std::__cxx11::stoi((data->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 8,(size_t *)0x0,10);
  this->total = (double)iVar1;
  std::__cxx11::string::assign((char *)&this->link);
  return;
}

Assistant:

Professor(std::vector<std::string> data) {
        prep_id = std::stoi(data[0]);
        name = data[1];
        surname = data[2];
        middle_name = data[3];
        knowledge = std::stoi(data[4]);
        skill = std::stoi(data[5]);
        social = std::stoi(data[6]);
        loyality = std::stoi(data[7]);
        total = std::stoi(data[8]);
        link = "";

    }